

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# variance_sse2.c
# Opt level: O1

uint64_t aom_mse_16xh_16bit_sse2(uint8_t *dst,int dstride,uint16_t *src,int w,int h)

{
  uint64_t uVar1;
  uint uVar2;
  ulong uVar3;
  uint64_t uVar4;
  
  uVar4 = 0;
  if (0 < (int)(0x10 / (long)w)) {
    uVar3 = 0x10 / (long)w & 0xffffffff;
    uVar4 = 0;
    do {
      uVar1 = aom_mse_wxh_16bit_sse2(dst,dstride,src,w,w,h);
      uVar4 = uVar4 + uVar1;
      dst = dst + w;
      src = src + h * w;
      uVar2 = (int)uVar3 - 1;
      uVar3 = (ulong)uVar2;
    } while (uVar2 != 0);
  }
  return uVar4;
}

Assistant:

uint64_t aom_mse_16xh_16bit_sse2(uint8_t *dst, int dstride, uint16_t *src,
                                 int w, int h) {
  assert((w == 8 || w == 4) && (h == 8 || h == 4) &&
         "w=8/4 and h=8/4 must be satisfied");
  const int num_blks = 16 / w;
  uint64_t sum = 0;
  for (int i = 0; i < num_blks; i++) {
    sum += aom_mse_wxh_16bit_sse2(dst, dstride, src, w, w, h);
    dst += w;
    src += (w * h);
  }
  return sum;
}